

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O3

void __thiscall
TasGrid::GridLocalPolynomial::applyTransformationTransposed<0,(TasGrid::RuleLocal::erule)2>
          (GridLocalPolynomial *this,double *weights,MultiIndexSet *work,
          vector<int,_std::allocator<int>_> *active_points)

{
  ulong *puVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  pointer piVar5;
  void *pvVar6;
  Data2D<int> *pDVar7;
  _Bit_type *p_Var8;
  pointer piVar9;
  int iVar10;
  long lVar11;
  Data2D<int> *pDVar12;
  pointer piVar13;
  int *piVar14;
  int iVar15;
  long lVar16;
  _Bit_type *p_Var17;
  uint uVar18;
  ulong uVar19;
  int *piVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  GridLocalPolynomial *pGVar27;
  uint uVar28;
  int iVar29;
  bool bVar30;
  double dVar31;
  vector<double,_std::allocator<double>_> node;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<int,_std::allocator<int>_> level;
  Data2D<int> lparents;
  allocator_type local_141;
  ulong local_140;
  int local_134;
  GridLocalPolynomial *local_130;
  int local_124;
  MultiIndexSet *local_120;
  vector<int,_std::allocator<int>_> *local_118;
  ulong local_110;
  ulong local_108;
  vector<double,_std::allocator<double>_> local_100;
  vector<bool,_std::allocator<bool>_> local_e8;
  vector<int,_std::allocator<int>_> local_c0;
  vector<int,_std::allocator<int>_> local_a8;
  vector<int,_std::allocator<int>_> local_90;
  Data2D<int> local_78;
  double *local_50;
  ulong local_48;
  long local_40;
  double local_38;
  
  local_124 = (int)(this->parents).num_strips;
  local_130 = this;
  local_120 = work;
  local_50 = weights;
  if (work->cache_num_indexes == local_124) {
    local_78.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_78.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_78.stride = 0;
    local_78.num_strips = 0;
    local_78.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_134 = local_124;
  }
  else {
    HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)2>(&local_78,work);
    local_134 = (int)(this->parents).num_strips;
    local_124 = work->cache_num_indexes;
  }
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_90,
             (long)(active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_e8);
  pGVar27 = local_130;
  piVar13 = (active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar11 = (long)(active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)piVar13;
  if (lVar11 == 0) {
    local_140 = 0;
  }
  else {
    lVar11 = lVar11 >> 2;
    sVar4 = local_120->num_dimensions;
    piVar5 = (local_120->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_140 = 0;
    lVar23 = 0;
    do {
      lVar26 = (long)piVar13[lVar23] * sVar4;
      uVar18 = piVar5[lVar26];
      uVar24 = uVar18;
      if ((1 < uVar18) && (uVar24 = 1, uVar18 != 2)) {
        uVar18 = uVar18 - 1;
        do {
          uVar18 = (int)uVar18 >> 1;
          uVar24 = uVar24 + 1;
        } while (1 < uVar18);
      }
      lVar25 = (long)(local_130->super_BaseCanonicalGrid).num_dimensions;
      if (1 < lVar25) {
        lVar16 = 1;
        do {
          uVar18 = piVar5[lVar26 + lVar16];
          uVar28 = uVar18;
          if ((1 < uVar18) && (uVar28 = 1, uVar18 != 2)) {
            uVar18 = uVar18 - 1;
            do {
              uVar18 = (int)uVar18 >> 1;
              uVar28 = uVar28 + 1;
            } while (1 < uVar18);
          }
          uVar24 = uVar24 + uVar28;
          lVar16 = lVar16 + 1;
        } while (lVar16 != lVar25);
      }
      if ((int)local_140 <= (int)uVar24) {
        local_140 = (ulong)uVar24;
      }
      local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar23] = uVar24;
      lVar23 = lVar23 + 1;
    } while (lVar23 != lVar11 + (ulong)(lVar11 == 0));
  }
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_a8,(long)local_130->top_level + 1,(allocator_type *)&local_e8);
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_c0,(long)pGVar27->top_level + 1,(allocator_type *)&local_e8);
  local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = 0;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            (&local_e8,(long)local_120->cache_num_indexes,(bool *)&local_100,&local_141);
  iVar15 = (local_130->super_BaseCanonicalGrid).num_dimensions;
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_100,(long)iVar15,(allocator_type *)&local_141);
  if (0 < (int)local_140) {
    uVar19 = (ulong)(uint)(iVar15 * 2);
    piVar9 = (active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar13 = (active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    pGVar27 = local_130;
    local_118 = active_points;
    local_108 = uVar19;
    do {
      bVar30 = piVar13 != piVar9;
      piVar13 = piVar9;
      if (bVar30) {
        uVar21 = 0;
        do {
          local_110 = uVar21;
          if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar21] == (int)local_140) {
            if (0 < (pGVar27->super_BaseCanonicalGrid).num_dimensions) {
              iVar15 = piVar9[uVar21];
              sVar4 = local_120->num_dimensions;
              piVar5 = (local_120->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar11 = 0;
              do {
                dVar31 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)2>
                                   (piVar5[(long)iVar15 * sVar4 + lVar11]);
                *(double *)
                 (CONCAT71(local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,
                           local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start._0_1_) + lVar11 * 8) = dVar31;
                lVar11 = lVar11 + 1;
                pGVar27 = local_130;
              } while (lVar11 < (local_130->super_BaseCanonicalGrid).num_dimensions);
            }
            uVar18 = local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
            p_Var8 = local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
            p_Var17 = local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            if (local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p !=
                local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_finish.super__Bit_iterator_base._M_p) {
              memset(local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                     (long)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
              p_Var17 = p_Var8;
              pGVar27 = local_130;
            }
            if (uVar18 != 0) {
              *p_Var17 = *p_Var17 & ~(0xffffffffffffffffU >> (-(char)uVar18 & 0x3fU));
            }
            *local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start = 0;
            piVar9 = (local_118->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            *local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start = piVar9[uVar21];
            if (*local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start < (int)uVar19) {
              iVar22 = 0;
              piVar14 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar20 = local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              iVar15 = local_134;
              iVar29 = local_124;
              do {
                iVar2 = piVar14[iVar22];
                if (iVar2 < (int)uVar19) {
                  pDVar12 = &pGVar27->parents;
                  if (iVar29 != iVar15) {
                    pDVar12 = &local_78;
                  }
                  pDVar7 = &pGVar27->parents;
                  if (iVar29 != iVar15) {
                    pDVar7 = &local_78;
                  }
                  iVar3 = *(int *)((long)piVar20[iVar22] * pDVar12->stride * 4 +
                                   (long)(pDVar7->vec).super__Vector_base<int,_std::allocator<int>_>
                                         ._M_impl.super__Vector_impl_data._M_start + (long)iVar2 * 4
                                  );
                  uVar19 = (ulong)iVar3;
                  if (uVar19 != 0xffffffffffffffff) {
                    iVar10 = iVar3 + 0x3f;
                    if (-1 < iVar3) {
                      iVar10 = iVar3;
                    }
                    uVar21 = (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001);
                    if ((local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [(long)(iVar10 >> 6) + (uVar21 - 1)] >> (uVar19 & 0x3f) & 1) == 0) {
                      lVar11 = local_120->num_dimensions * uVar19;
                      piVar5 = (local_120->indexes).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                      local_48 = 1L << ((byte)iVar3 & 0x3f);
                      local_40 = (long)(iVar10 >> 6) * 8;
                      dVar31 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)2>
                                         (pGVar27->order,piVar5[lVar11],
                                          *(double *)
                                           CONCAT71(local_100.
                                                                                                        
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  local_100.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_));
                      if (1 < (pGVar27->super_BaseCanonicalGrid).num_dimensions) {
                        lVar23 = 1;
                        do {
                          local_38 = dVar31;
                          dVar31 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)2>
                                             (pGVar27->order,piVar5[lVar11 + lVar23],
                                              *(double *)
                                               (CONCAT71(local_100.
                                                                                                                  
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  local_100.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                                               lVar23 * 8));
                          dVar31 = local_38 * dVar31;
                          lVar23 = lVar23 + 1;
                        } while (lVar23 < (pGVar27->super_BaseCanonicalGrid).num_dimensions);
                      }
                      piVar9 = (local_118->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start;
                      local_50[uVar19] = local_50[uVar19] - dVar31 * local_50[piVar9[local_110]];
                      puVar1 = (ulong *)((long)local_e8.super__Bvector_base<std::allocator<bool>_>.
                                               _M_impl.super__Bvector_impl_data._M_start.
                                               super__Bit_iterator_base._M_p +
                                        uVar21 * 8 + -8 + local_40);
                      *puVar1 = *puVar1 | local_48;
                      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)iVar22 + 1] = 0;
                      local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)iVar22 + 1] = iVar3;
                      piVar14 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
                      piVar20 = local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
                      uVar19 = local_108;
                      iVar15 = local_134;
                      iVar22 = iVar22 + 1;
                      iVar29 = local_124;
                      goto LAB_00197994;
                    }
                  }
                  piVar14[iVar22] = iVar2 + 1;
                  uVar19 = local_108;
                }
                else {
                  piVar14[(long)iVar22 + -1] = piVar14[(long)iVar22 + -1] + 1;
                  iVar22 = iVar22 + -1;
                }
LAB_00197994:
              } while (*piVar14 < (int)uVar19);
            }
          }
          uVar21 = local_110 + 1;
          piVar13 = (local_118->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        } while (uVar21 < (ulong)((long)piVar13 - (long)piVar9 >> 2));
      }
      iVar15 = (int)local_140;
      local_140 = (ulong)(iVar15 - 1);
    } while (1 < iVar15);
  }
  pvVar6 = (void *)CONCAT71(local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_,
                            local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_);
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6,(long)local_100.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar6);
  }
  if (local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (ulong *)0x0;
  }
  if (local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridLocalPolynomial::applyTransformationTransposed(double weights[], const MultiIndexSet &work, const std::vector<int> &active_points) const {
    Data2D<int> lparents = (parents.getNumStrips() != work.getNumIndexes()) ? // if the current dag loaded in parents does not reflect the indexes in work
                            HierarchyManipulations::computeDAGup<effrule>(work) :
                            Data2D<int>();

    const Data2D<int> &dagUp = (parents.getNumStrips() != work.getNumIndexes()) ? lparents : parents;

    std::vector<int> level(active_points.size());
    int active_top_level = 0;
    for(size_t i=0; i<active_points.size(); i++){
        const int *p = work.getIndex(active_points[i]);
        int current_level = RuleLocal::getLevel<effrule>(p[0]);
        for(int j=1; j<num_dimensions; j++){
            current_level += RuleLocal::getLevel<effrule>(p[j]);
        }
        if (active_top_level < current_level) active_top_level = current_level;
        level[i] = current_level;
    }

    std::vector<int> monkey_count(top_level+1);
    std::vector<int> monkey_tail(top_level+1);
    std::vector<bool> used(work.getNumIndexes());
    int max_parents = RuleLocal::getMaxNumParents<effrule>() * num_dimensions;

    std::vector<double> node(num_dimensions);

    for(int l=active_top_level; l>0; l--){
        for(size_t i=0; i<active_points.size(); i++){
            if (level[i] == l){
                int const *pnt = work.getIndex(active_points[i]);
                for(int j=0; j<num_dimensions; j++)
                    node[j] = RuleLocal::getNode<effrule>(pnt[j]);

                std::fill(used.begin(), used.end(), false);

                monkey_count[0] = 0;
                monkey_tail[0] = active_points[i];
                int current = 0;

                while(monkey_count[0] < max_parents){
                    if (monkey_count[current] < max_parents){
                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                        if ((branch == -1) || used[branch]){
                            monkey_count[current]++;
                        }else{
                            const int *func = work.getIndex(branch);
                            double basis_value = RuleLocal::evalRaw<effrule>(order, func[0], node[0]);
                            for(int j=1; j<num_dimensions; j++) basis_value *= RuleLocal::evalRaw<effrule>(order, func[j], node[j]);

                            if (mode == 0) {
                                weights[branch] -= weights[active_points[i]] * basis_value;
                            } else {
                                for (int d=0; d<num_dimensions; d++)
                                    weights[branch * num_dimensions + d] -=
                                            weights[active_points[i] * num_dimensions + d] * basis_value;
                            }
                            used[branch] = true;

                            monkey_count[++current] = 0;
                            monkey_tail[current] = branch;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }
    }
}